

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warm_cb.cc
# Opt level: O1

void setup_lambdas(warm_cb *data)

{
  pointer *ppfVar1;
  iterator __position;
  pointer pfVar2;
  uint uVar3;
  ulong in_RAX;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  float fVar8;
  undefined8 uStack_28;
  
  uVar3 = data->choices_lambda;
  if (uVar3 != 0) {
    uVar6 = 0;
    uStack_28 = in_RAX;
    do {
      uStack_28 = uStack_28 & 0xffffffff;
      __position._M_current =
           (data->lambdas).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (data->lambdas).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                  (&data->lambdas,__position,(float *)((long)&uStack_28 + 4));
      }
      else {
        *__position._M_current = 0.0;
        ppfVar1 = &(data->lambdas).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppfVar1 = *ppfVar1 + 1;
      }
      uVar6 = uVar6 + 1;
      uVar3 = data->choices_lambda;
    } while (uVar6 < uVar3);
  }
  if ((data->upd_ws == false) && (data->upd_inter == true)) {
    if (data->choices_lambda != 0) {
      uVar4 = 0;
      do {
        (data->lambdas).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start[uVar4] = 1.0;
        uVar4 = uVar4 + 1;
      } while (uVar4 < data->choices_lambda);
    }
  }
  else if ((data->upd_ws == false) || (data->upd_inter != false)) {
    uVar6 = uVar3 >> 1;
    uVar4 = (ulong)uVar6;
    if (data->lambda_scheme - 1U < 2) {
      fVar8 = 0.5;
    }
    else {
      fVar8 = data->epsilon / (data->epsilon + 1.0);
    }
    (data->lambdas).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_start[uVar4] = fVar8;
    if (1 < uVar3) {
      uVar5 = (ulong)(uVar6 - 1);
      uVar7 = uVar6;
      do {
        pfVar2 = (data->lambdas).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pfVar2[uVar5] = pfVar2[uVar7] * 0.5;
        uVar5 = uVar5 - 1;
        uVar7 = uVar7 - 1;
      } while (uVar7 != 0);
    }
    if (uVar6 + 1 < data->choices_lambda) {
      uVar5 = (ulong)((uVar3 >> 1) + 1);
      do {
        pfVar2 = (data->lambdas).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pfVar2[uVar5] = (1.0 - pfVar2[uVar4]) * -0.5 + 1.0;
        uVar4 = uVar5 & 0xffffffff;
        uVar5 = uVar5 + 1;
      } while (uVar5 < data->choices_lambda);
    }
    if ((data->lambda_scheme == 2) || (data->lambda_scheme == 4)) {
      *(data->lambdas).super__Vector_base<float,_std::allocator<float>_>._M_impl.
       super__Vector_impl_data._M_start = 0.0;
      (data->lambdas).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start[data->choices_lambda - 1] = 1.0;
    }
  }
  else if (data->choices_lambda != 0) {
    uVar4 = 0;
    do {
      (data->lambdas).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start[uVar4] = 0.0;
      uVar4 = uVar4 + 1;
    } while (uVar4 < data->choices_lambda);
  }
  return;
}

Assistant:

void setup_lambdas(warm_cb& data)
{
	// The lambdas are arranged in ascending order
	vector<float>& lambdas = data.lambdas;
	for (uint32_t i = 0; i<data.choices_lambda; i++)
		lambdas.push_back(0.f);

	//interaction only: set all lambda's to be identically 1
	if (!data.upd_ws && data.upd_inter)
	{
		for (uint32_t i = 0; i<data.choices_lambda; i++)
			lambdas[i] = 1.0;
		return;
	}

	//warm start only: set all lambda's to be identically 0
	if (!data.upd_inter && data.upd_ws)
	{
		for (uint32_t i = 0; i<data.choices_lambda; i++)
			lambdas[i] = 0.0;
		return;
	}

	uint32_t mid = data.choices_lambda / 2;

	if (data.lambda_scheme == ABS_CENTRAL || data.lambda_scheme == ABS_CENTRAL_ZEROONE)
		lambdas[mid] = 0.5;
	else
		lambdas[mid] = minimax_lambda(data.epsilon);

	for (uint32_t i = mid; i > 0; i--)
		lambdas[i-1] = lambdas[i] / 2.0;

	for (uint32_t i = mid+1; i < data.choices_lambda; i++)
		lambdas[i] = 1 - (1-lambdas[i-1]) / 2.0;

	if (data.lambda_scheme == MINIMAX_CENTRAL_ZEROONE || data.lambda_scheme == ABS_CENTRAL_ZEROONE)
	{
		lambdas[0] = 0.0;
		lambdas[data.choices_lambda-1] = 1.0;
	}
}